

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmOutputRequiredFilesCommand.cxx
# Opt level: O1

void __thiscall cmLBDepend::GenerateDependInformation(cmLBDepend *this,cmDependInformation *info)

{
  pointer pbVar1;
  cmMakefile *this_00;
  size_t sVar2;
  pointer pcVar3;
  bool bVar4;
  bool bVar5;
  int iVar6;
  cmSourceFile *pcVar7;
  string *psVar8;
  const_iterator __begin3;
  pointer pbVar9;
  string incpath;
  string local_88;
  string *local_68;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_60;
  pointer local_40;
  cmSourceFile *local_38;
  
  if (info->DependDone != false) {
    return;
  }
  info->DependDone = true;
  if ((info->FullPath)._M_string_length == 0) {
    local_88._M_dataplus._M_p = (pointer)&local_88.field_2;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_88,"Attempt to find dependencies for file without path!","");
    cmSystemTools::Error(&local_88);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_88._M_dataplus._M_p == &local_88.field_2) {
      return;
    }
  }
  else {
    local_68 = &info->FullPath;
    bVar5 = cmsys::SystemTools::FileExists(local_68,true);
    if (bVar5) {
      DependWalk(this,info);
    }
    pcVar7 = info->SourceFile;
    if (pcVar7 != (cmSourceFile *)0x0) {
      pbVar9 = (pcVar7->Depends).
               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ._M_impl.super__Vector_impl_data._M_start;
      pbVar1 = (pcVar7->Depends).
               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ._M_impl.super__Vector_impl_data._M_finish;
      if (pbVar9 != pbVar1) {
        do {
          AddDependency(this,info,(pbVar9->_M_dataplus)._M_p);
          pbVar9 = pbVar9 + 1;
        } while (pbVar9 != pbVar1);
        bVar5 = true;
      }
    }
    bVar4 = bVar5;
    if (!bVar5) {
      this_00 = this->Makefile;
      cmsys::SystemTools::GetFilenameWithoutExtension(&local_88,local_68);
      pcVar7 = cmMakefile::GetSource(this_00,&local_88,Ambiguous);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_88._M_dataplus._M_p != &local_88.field_2) {
        operator_delete(local_88._M_dataplus._M_p,local_88.field_2._M_allocated_capacity + 1);
      }
      if (pcVar7 != (cmSourceFile *)0x0) {
        local_38 = pcVar7;
        psVar8 = cmSourceFile::GetFullPath(pcVar7,(string *)0x0);
        sVar2 = psVar8->_M_string_length;
        if ((sVar2 != (info->FullPath)._M_string_length) ||
           ((bVar4 = true, sVar2 != 0 &&
            (iVar6 = bcmp((psVar8->_M_dataplus)._M_p,(local_68->_M_dataplus)._M_p,sVar2), iVar6 != 0
            )))) {
          pbVar9 = (this->IncludeDirectories).
                   super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_start;
          local_40 = (this->IncludeDirectories).
                     super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_finish;
          bVar4 = bVar5;
          if (pbVar9 != local_40) {
            do {
              local_88._M_dataplus._M_p = (pointer)&local_88.field_2;
              pcVar3 = (pbVar9->_M_dataplus)._M_p;
              std::__cxx11::string::_M_construct<char*>
                        ((string *)&local_88,pcVar3,pcVar3 + pbVar9->_M_string_length);
              if ((local_88._M_string_length != 0) &&
                 (local_88._M_dataplus._M_p[local_88._M_string_length - 1] != '/')) {
                local_60._M_dataplus._M_p = (pointer)&local_60.field_2;
                std::__cxx11::string::_M_construct<char*>
                          ((string *)&local_60,local_88._M_dataplus._M_p,
                           local_88._M_dataplus._M_p + local_88._M_string_length);
                std::__cxx11::string::append((char *)&local_60);
                std::__cxx11::string::operator=((string *)&local_88,(string *)&local_60);
                if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)local_60._M_dataplus._M_p != &local_60.field_2) {
                  operator_delete(local_60._M_dataplus._M_p,
                                  local_60.field_2._M_allocated_capacity + 1);
                }
              }
              std::operator+(&local_60,&local_88,local_68);
              std::__cxx11::string::operator=((string *)&local_88,(string *)&local_60);
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_60._M_dataplus._M_p != &local_60.field_2) {
                operator_delete(local_60._M_dataplus._M_p,local_60.field_2._M_allocated_capacity + 1
                               );
              }
              psVar8 = cmSourceFile::GetFullPath(local_38,(string *)0x0);
              sVar2 = psVar8->_M_string_length;
              if ((sVar2 == local_88._M_string_length) &&
                 ((sVar2 == 0 ||
                  (iVar6 = bcmp((psVar8->_M_dataplus)._M_p,local_88._M_dataplus._M_p,sVar2),
                  iVar6 == 0)))) {
                bVar4 = true;
                std::__cxx11::string::_M_assign((string *)local_68);
              }
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_88._M_dataplus._M_p != &local_88.field_2) {
                operator_delete(local_88._M_dataplus._M_p,local_88.field_2._M_allocated_capacity + 1
                               );
              }
              pbVar9 = pbVar9 + 1;
            } while (pbVar9 != local_40);
          }
        }
      }
    }
    if (bVar4) {
      return;
    }
    bVar5 = cmsys::RegularExpression::find
                      (&this->ComplainFileRegularExpression,(info->IncludeName)._M_dataplus._M_p,
                       &(this->ComplainFileRegularExpression).regmatch);
    if (!bVar5) {
      (info->FullPath)._M_string_length = 0;
      *(info->FullPath)._M_dataplus._M_p = '\0';
      return;
    }
    std::operator+(&local_88,"error cannot find dependencies for ",local_68);
    cmSystemTools::Error(&local_88);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_88._M_dataplus._M_p == &local_88.field_2) {
      return;
    }
  }
  operator_delete(local_88._M_dataplus._M_p,local_88.field_2._M_allocated_capacity + 1);
  return;
}

Assistant:

void GenerateDependInformation(cmDependInformation* info)
  {
    // If dependencies are already done, stop now.
    if (info->DependDone) {
      return;
    }
    // Make sure we don't visit the same file more than once.
    info->DependDone = true;

    const std::string& path = info->FullPath;
    if (path.empty()) {
      cmSystemTools::Error(
        "Attempt to find dependencies for file without path!");
      return;
    }

    bool found = false;

    // If the file exists, use it to find dependency information.
    if (cmSystemTools::FileExists(path, true)) {
      // Use the real file to find its dependencies.
      this->DependWalk(info);
      found = true;
    }

    // See if the cmSourceFile for it has any files specified as
    // dependency hints.
    if (info->SourceFile != nullptr) {

      // Get the cmSourceFile corresponding to this.
      const cmSourceFile& cFile = *(info->SourceFile);
      // See if there are any hints for finding dependencies for the missing
      // file.
      if (!cFile.GetDepends().empty()) {
        // Dependency hints have been given.  Use them to begin the
        // recursion.
        for (std::string const& file : cFile.GetDepends()) {
          this->AddDependency(info, file.c_str());
        }

        // Found dependency information.  We are done.
        found = true;
      }
    }

    if (!found) {
      // Try to find the file amongst the sources
      cmSourceFile* srcFile = this->Makefile->GetSource(
        cmSystemTools::GetFilenameWithoutExtension(path));
      if (srcFile) {
        if (srcFile->GetFullPath() == path) {
          found = true;
        } else {
          // try to guess which include path to use
          for (std::string incpath : this->IncludeDirectories) {
            if (!incpath.empty() && incpath.back() != '/') {
              incpath = incpath + "/";
            }
            incpath = incpath + path;
            if (srcFile->GetFullPath() == incpath) {
              // set the path to the guessed path
              info->FullPath = incpath;
              found = true;
            }
          }
        }
      }
    }

    if (!found) {
      // Couldn't find any dependency information.
      if (this->ComplainFileRegularExpression.find(info->IncludeName)) {
        cmSystemTools::Error("error cannot find dependencies for " + path);
      } else {
        // Destroy the name of the file so that it won't be output as a
        // dependency.
        info->FullPath.clear();
      }
    }
  }